

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

Node * FindNode(Node *root,string *name)

{
  __type _Var1;
  Node *pNVar2;
  pointer ppNVar3;
  
  _Var1 = std::operator==(&root->mName,name);
  pNVar2 = root;
  if (!_Var1) {
    ppNVar3 = (root->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppNVar3 ==
          (root->mChildren).
          super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return (Node *)0x0;
      }
      pNVar2 = FindNode(*ppNVar3,name);
      ppNVar3 = ppNVar3 + 1;
    } while (pNVar2 == (Node *)0x0);
  }
  return pNVar2;
}

Assistant:

D3DS::Node* FindNode(D3DS::Node* root, const std::string& name)
{
    if (root->mName == name)
        return root;
    for (std::vector<D3DS::Node*>::iterator it = root->mChildren.begin();it != root->mChildren.end(); ++it) {
        D3DS::Node* nd;
        if (( nd = FindNode(*it,name)))
            return nd;
    }
    return NULL;
}